

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O1

void __thiscall APITests::test_setup_multiple_outputs2(APITests *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  long *plVar8;
  string *__str_1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<int> __l_00;
  string __str;
  allocator_type local_aa;
  allocator_type local_a9;
  vector<int,_std::allocator<int>_> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  int local_78 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50 [2];
  long local_40 [2];
  
  GPIO::setmode(BOARD);
  uVar1 = (this->pin_data).out_a;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar7 = 1;
  if (9 < uVar2) {
    uVar5 = (ulong)uVar2;
    uVar3 = 4;
    do {
      uVar7 = uVar3;
      uVar4 = (uint)uVar5;
      if (uVar4 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_00112e66;
      }
      if (uVar4 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_00112e66;
      }
      if (uVar4 < 10000) goto LAB_00112e66;
      uVar5 = uVar5 / 10000;
      uVar3 = uVar7 + 4;
    } while (99999 < uVar4);
    uVar7 = uVar7 + 1;
  }
LAB_00112e66:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar7 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p + (uVar1 >> 0x1f),uVar7,uVar2);
  uVar1 = (this->pin_data).out_b;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar7 = 1;
  if (9 < uVar2) {
    uVar5 = (ulong)uVar2;
    uVar3 = 4;
    do {
      uVar7 = uVar3;
      uVar4 = (uint)uVar5;
      if (uVar4 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_00112f03;
      }
      if (uVar4 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_00112f03;
      }
      if (uVar4 < 10000) goto LAB_00112f03;
      uVar5 = uVar5 / 10000;
      uVar3 = uVar7 + 4;
    } while (99999 < uVar4);
    uVar7 = uVar7 + 1;
  }
LAB_00112f03:
  plVar8 = local_40;
  local_50[0] = plVar8;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar7 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_50[0]),uVar7,uVar2);
  __l._M_len = 2;
  __l._M_array = &local_70;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_90,__l,&local_a9);
  local_78[0] = 0;
  local_78[1] = 1;
  __l_00._M_len = 2;
  __l_00._M_array = local_78;
  std::vector<int,_std::allocator<int>_>::vector(&local_a8,__l_00,&local_aa);
  GPIO::setup((vector *)&local_90,OUT,(vector *)&local_a8);
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90);
  lVar6 = -0x40;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  GPIO::cleanup();
  return;
}

Assistant:

void test_setup_multiple_outputs2()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup({std::to_string(pin_data.out_a), std::to_string(pin_data.out_b)}, GPIO::OUT, {GPIO::LOW, GPIO::HIGH});
        GPIO::cleanup();
    }